

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

void __thiscall
capnp::_::BuilderArena::BuilderArena
          (BuilderArena *this,MessageBuilder *message,
          ArrayPtr<capnp::MessageBuilder::SegmentInit> segments)

{
  _ *this_00;
  SegmentWordCount SVar1;
  SegmentWordCount SVar2;
  ulong size;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t sVar3;
  long lVar4;
  uint uVar5;
  ArrayPtr<const_capnp::word> segment;
  ArrayPtr<const_capnp::word> segment_00;
  ReadLimiter *local_108;
  MultiSegmentState *pMStack_100;
  BuilderArena *local_f0;
  Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> local_e8;
  SegmentWordCount local_cc;
  SegmentWordCount local_c8;
  Id<unsigned_int,_capnp::_::Segment> local_c4;
  Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *local_c0;
  Vector<kj::ArrayPtr<const_capnp::word>_> forOutput;
  Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_> builders;
  MultiSegmentState local_70;
  
  size = segments.size_;
  segment.size_ = segments.ptr;
  (this->super_Arena)._vptr_Arena = (_func_int **)&PTR__BuilderArena_0066a2e0;
  this->message = message;
  (this->dummyLimiter).limit = 0xffffffffffffffff;
  (this->localCapTable).super_CapTableBuilder.super_CapTableReader._vptr_CapTableReader =
       (_func_int **)&PTR_extractCap_0066a398;
  (this->localCapTable).capTable.builder.ptr =
       (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
  (this->localCapTable).capTable.builder.pos =
       (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0;
  (this->localCapTable).capTable.builder.endPtr =
       (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
  (this->localCapTable).capTable.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  this_00 = (_ *)((segment.size_)->space).ptr;
  segment.ptr = (word *)((segment.size_)->space).size_;
  SVar1 = verifySegment(this_00,segment);
  SVar2 = verifySegmentSize((segment.size_)->wordsUsed);
  (this->segment0).super_SegmentReader.arena = &this->super_Arena;
  (this->segment0).super_SegmentReader.id.value = 0;
  (this->segment0).super_SegmentReader.ptr.ptr = (word *)this_00;
  (this->segment0).super_SegmentReader.ptr.size_ = (ulong)SVar1;
  (this->segment0).super_SegmentReader.readLimiter = &this->dummyLimiter;
  (this->segment0).pos = (word *)(this_00 + (ulong)SVar2 * 8);
  (this->segment0).readOnly = false;
  this->segmentWithSpace = (SegmentBuilder *)0x0;
  (this->segment0ForOutput).ptr = (word *)0x0;
  (this->segment0ForOutput).size_ = 0;
  (this->moreSegments).ptr.disposer = (Disposer *)0x0;
  (this->moreSegments).ptr.ptr = (MultiSegmentState *)0x0;
  if (size < 2) {
    this->segmentWithSpace = &this->segment0;
  }
  else {
    local_c0 = &(this->moreSegments).ptr;
    local_f0 = this;
    builders.builder.ptr =
         kj::_::HeapArrayDisposer::
         allocateUninitialized<kj::Own<capnp::_::SegmentBuilder,decltype(nullptr)>>(size - 1);
    builders.builder.endPtr = builders.builder.ptr + (size - 1);
    builders.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    uVar5 = 1;
    sVar3 = extraout_RDX;
    builders.builder.pos = builders.builder.ptr;
    for (lVar4 = 0; size * 0x18 + -0x18 != lVar4; lVar4 = lVar4 + 0x18) {
      forOutput.builder.ptr = (ArrayPtr<const_capnp::word> *)local_f0;
      local_e8.disposer = *(Disposer **)((long)&segment.size_[1].space.ptr + lVar4);
      segment_00.size_ = sVar3;
      segment_00.ptr = *(word **)((long)&segment.size_[1].space.size_ + lVar4);
      local_c4.value = uVar5;
      local_c8 = verifySegment((_ *)local_e8.disposer,segment_00);
      local_108 = &this->dummyLimiter;
      local_cc = verifySegmentSize(*(size_t *)((long)&segment.size_[1].wordsUsed + lVar4));
      kj::
      heap<capnp::_::SegmentBuilder,capnp::_::BuilderArena*,kj::Id<unsigned_int,capnp::_::Segment>,capnp::word*,unsigned_int,capnp::_::ReadLimiter*,unsigned_int>
                ((kj *)&local_70,(BuilderArena **)&forOutput,&local_c4,(word **)&local_e8,&local_c8,
                 &local_108,&local_cc);
      kj::Vector<kj::Own<capnp::_::SegmentBuilder,decltype(nullptr)>>::
      add<kj::Own<capnp::_::SegmentBuilder,decltype(nullptr)>>
                ((Vector<kj::Own<capnp::_::SegmentBuilder,decltype(nullptr)>> *)&builders,
                 (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)&local_70);
      sVar3 = extraout_RDX_00;
      if (local_70.builders.builder.pos != (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0) {
        local_70.builders.builder.pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
        (*(code *)(local_70.builders.builder.ptr)->disposer->_vptr_Disposer)();
        sVar3 = extraout_RDX_01;
      }
      uVar5 = uVar5 + 1;
    }
    forOutput.builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    forOutput.builder.pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
    forOutput.builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
    forOutput.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
    kj::Vector<kj::ArrayPtr<const_capnp::word>_>::resize(&forOutput,size);
    local_f0->segmentWithSpace = builders.builder.pos[-1].ptr;
    local_70.builders.builder.ptr = builders.builder.ptr;
    local_70.builders.builder.pos = builders.builder.pos;
    local_70.builders.builder.endPtr = builders.builder.endPtr;
    local_70.builders.builder.disposer = builders.builder.disposer;
    builders.builder.ptr = (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)0x0;
    builders.builder.pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
    builders.builder.endPtr = (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)0x0;
    local_70.forOutput.builder.ptr = forOutput.builder.ptr;
    local_70.forOutput.builder.pos = forOutput.builder.pos;
    local_70.forOutput.builder.endPtr = forOutput.builder.endPtr;
    local_70.forOutput.builder.disposer = forOutput.builder.disposer;
    forOutput.builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    forOutput.builder.pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
    forOutput.builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
    kj::heap<capnp::_::BuilderArena::MultiSegmentState>((kj *)&local_108,&local_70);
    local_e8.disposer = (Disposer *)local_108;
    local_e8.ptr = pMStack_100;
    pMStack_100 = (MultiSegmentState *)0x0;
    kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>::operator=
              (local_c0,&local_e8);
    if (local_e8.ptr != (MultiSegmentState *)0x0) {
      local_e8.ptr = (MultiSegmentState *)0x0;
      (**(local_e8.disposer)->_vptr_Disposer)();
    }
    if (pMStack_100 != (MultiSegmentState *)0x0) {
      pMStack_100 = (MultiSegmentState *)0x0;
      (**(code **)local_108->limit)();
    }
    MultiSegmentState::~MultiSegmentState(&local_70);
    kj::ArrayBuilder<kj::ArrayPtr<const_capnp::word>_>::dispose(&forOutput.builder);
    kj::ArrayBuilder<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::dispose(&builders.builder)
    ;
  }
  return;
}

Assistant:

BuilderArena::BuilderArena(MessageBuilder* message,
                           kj::ArrayPtr<MessageBuilder::SegmentInit> segments)
    : message(message),
      segment0(this, SegmentId(0), segments[0].space.begin(),
               verifySegment(segments[0].space),
               &this->dummyLimiter, verifySegmentSize(segments[0].wordsUsed)) {
  if (segments.size() > 1) {
    kj::Vector<kj::Own<SegmentBuilder>> builders(segments.size() - 1);

    uint i = 1;
    for (auto& segment: segments.slice(1, segments.size())) {
      builders.add(kj::heap<SegmentBuilder>(
          this, SegmentId(i++), segment.space.begin(), verifySegment(segment.space),
          &this->dummyLimiter, verifySegmentSize(segment.wordsUsed)));
    }

    kj::Vector<kj::ArrayPtr<const word>> forOutput;
    forOutput.resize(segments.size());

    segmentWithSpace = builders.back();

    this->moreSegments = kj::heap<MultiSegmentState>(
        MultiSegmentState { kj::mv(builders), kj::mv(forOutput) });

  } else {
    segmentWithSpace = &segment0;
  }
}